

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O3

void __thiscall CTcTokenizer::copytok(CTcTokenizer *this,CTcToken *dst,CTcToken *src)

{
  char *pcVar1;
  size_t len;
  char *__dest;
  ulong uVar2;
  tc_toktyp_t tVar3;
  undefined4 uVar4;
  int iVar5;
  
  dst->field_0x20 = src->field_0x20;
  tVar3 = src->typ_;
  uVar4 = *(undefined4 *)&src->field_0x4;
  pcVar1 = src->text_;
  uVar2 = src->int_val_;
  dst->text_len_ = src->text_len_;
  dst->int_val_ = uVar2;
  dst->typ_ = tVar3;
  *(undefined4 *)&dst->field_0x4 = uVar4;
  dst->text_ = pcVar1;
  iVar5 = is_tok_safe(this,src->typ_);
  if (iVar5 == 0) {
    pcVar1 = dst->text_;
    len = dst->text_len_;
    reserve_source(this,len);
    __dest = this->src_ptr_;
    memcpy(__dest,pcVar1,len);
    pcVar1 = this->src_ptr_;
    this->src_ptr_ = pcVar1 + len;
    this->src_rem_ = this->src_rem_ - len;
    pcVar1[len] = '\0';
    this->src_ptr_ = this->src_ptr_ + 1;
    this->src_rem_ = this->src_rem_ - 1;
    dst->text_ = __dest;
  }
  return;
}

Assistant:

void CTcTokenizer::copytok(CTcToken *dst, const CTcToken *src)
{
    /* start with an exact copy of the token */
    *dst = *src;

    /* if the token is a symbol, it already has a safe copy */
    if (is_tok_safe(src->gettyp()))
        return;

    /* save the token's text in permanent tokenizer memory */
    dst->set_text(store_source(dst->get_text(), dst->get_text_len()),
                  dst->get_text_len());
}